

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

double __thiscall
RandomForest::Node<float>::PredictOneSample
          (Node<float> *this,shared_ptr<std::vector<float,_std::allocator<float>_>_> *i_inData)

{
  Node<float> *pNVar1;
  __shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  reference pvVar3;
  double local_48;
  __shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((long)this->featureIndex == 0xffffffffffffffff) {
    local_48 = this->splitValue;
  }
  else {
    pvVar3 = std::vector<float,_std::allocator<float>_>::at
                       ((i_inData->
                        super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr,(long)this->featureIndex);
    if ((double)*pvVar3 < this->splitValue || (double)*pvVar3 == this->splitValue) {
      pNVar1 = (this->right).
               super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_40,
                   &i_inData->
                    super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      local_48 = PredictOneSample(pNVar1,(shared_ptr<std::vector<float,_std::allocator<float>_>_> *)
                                         &local_40);
      p_Var2 = &local_40;
    }
    else {
      pNVar1 = (this->left).
               super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_30,
                   &i_inData->
                    super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      local_48 = PredictOneSample(pNVar1,(shared_ptr<std::vector<float,_std::allocator<float>_>_> *)
                                         &local_30);
      p_Var2 = &local_30;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
  }
  return local_48;
}

Assistant:

double RandomForest::Node<T>::PredictOneSample(const std::shared_ptr<std::vector<T> > i_inData)
{
    if (featureIndex == -1)
    {
        return splitValue;
    }
    if (i_inData->at(featureIndex)>splitValue)
    {
        return left->PredictOneSample(i_inData);
    }
    else
    {
        return right->PredictOneSample(i_inData);
    }
}